

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O1

void __thiscall Saturation::SaturationAlgorithm::onAllProcessed(SaturationAlgorithm *this)

{
  if (this->_symEl != (SymElOutput *)0x0) {
    SymElOutput::onAllProcessed(this->_symEl);
  }
  if (this->_splitter != (Splitter *)0x0) {
    Splitter::onAllProcessed(this->_splitter);
  }
  if (this->_consFinder != (ConsequenceFinder *)0x0) {
    ConsequenceFinder::onAllProcessed(this->_consFinder);
    return;
  }
  return;
}

Assistant:

void SaturationAlgorithm::onAllProcessed()
{
  ASS(clausesFlushed());

  if (_symEl) {
    _symEl->onAllProcessed();
  }

  if (_splitter) {
    _splitter->onAllProcessed();
  }

  if (_consFinder) {
    _consFinder->onAllProcessed();
  }
}